

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O3

FUNCTIONALITY_SUPPORT gl4cts::BufferStorage::getDirectStateAccessSupport(Context *context)

{
  FUNCTIONALITY_SUPPORT FVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  
  FVar1 = m_direct_state_access_support;
  if (m_direct_state_access_support == FUNCTIONALITY_SUPPORT_NOT_DETERMINED) {
    iVar3 = (*context->m_renderCtx->_vptr_RenderContext[3])();
    bVar2 = isGLVersionAtLeast((Functions *)CONCAT44(extraout_var,iVar3),4,5);
    FVar1 = FUNCTIONALITY_SUPPORT_CORE;
    if (!bVar2) {
      bVar2 = glu::ContextInfo::isExtensionSupported
                        (context->m_contextInfo,"GL_ARB_direct_state_access");
      FVar1 = (uint)bVar2;
    }
  }
  m_direct_state_access_support = FVar1;
  return m_direct_state_access_support;
}

Assistant:

FUNCTIONALITY_SUPPORT getDirectStateAccessSupport(deqp::Context& context)
{
	if (FUNCTIONALITY_SUPPORT_NOT_DETERMINED == m_direct_state_access_support)
	{
		const Functions& gl = context.getRenderContext().getFunctions();

		if (true == isGLVersionAtLeast(gl, 4, 5))
		{
			m_direct_state_access_support = FUNCTIONALITY_SUPPORT_CORE;
		}
		else
		{
			bool is_supported = context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

			if (true == is_supported)
			{
				m_direct_state_access_support = FUNCTIONALITY_SUPPORT_EXTENSION;
			}
			else
			{
				m_direct_state_access_support = FUNCTIONALITY_SUPPORT_NONE;
			}
		}
	}

	return m_direct_state_access_support;
}